

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O3

CharMapper<unsigned_char> * gmlc::utilities::pairMapper(void)

{
  undefined1 auVar1 [16];
  CharMapper<unsigned_char> *in_RDI;
  uchar uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar23;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar5;
  
  lVar3 = 0;
  memset(in_RDI,0,0x100);
  auVar1 = _DAT_003e47d0;
  auVar4 = _DAT_003e4750;
  auVar6 = _DAT_003e4760;
  auVar7 = _DAT_003e4770;
  auVar8 = _DAT_003e4780;
  auVar9 = _DAT_003e4790;
  auVar10 = _DAT_003e47a0;
  auVar11 = _DAT_003e47b0;
  auVar12 = _DAT_003e47c0;
  do {
    auVar14 = auVar12 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar24._4_4_ = iVar13;
    auVar24._0_4_ = iVar13;
    auVar24._8_4_ = iVar23;
    auVar24._12_4_ = iVar23;
    auVar32._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar32._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar32._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar32._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar15._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar32;
    auVar14 = pshuflw(auVar24,auVar15,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    uVar2 = (uchar)lVar3;
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3] = uVar2;
    }
    auVar14 = packssdw(auVar15,auVar15);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 1] = uVar2 + '\x01';
    }
    auVar14 = auVar11 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar25._4_4_ = iVar13;
    auVar25._0_4_ = iVar13;
    auVar25._8_4_ = iVar23;
    auVar25._12_4_ = iVar23;
    auVar33._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar33._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar33._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar33._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar16._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar33;
    auVar14 = packssdw(auVar25,auVar16);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 2] = uVar2 + '\x02';
    }
    auVar14 = pshufhw(auVar16,auVar16,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x18 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 3] = uVar2 + '\x03';
    }
    auVar14 = auVar10 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar23;
    auVar26._12_4_ = iVar23;
    auVar34._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar34._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar34._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar34._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar17._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar34;
    auVar14 = pshuflw(auVar26,auVar17,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 4] = uVar2 + '\x04';
    }
    auVar14 = packssdw(auVar17,auVar17);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._4_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 5] = uVar2 + '\x05';
    }
    auVar14 = auVar9 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar23;
    auVar27._12_4_ = iVar23;
    auVar35._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar35._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar35._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar35._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar18._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar35;
    auVar14 = packssdw(auVar27,auVar18);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 6] = uVar2 + '\x06';
    }
    auVar14 = pshufhw(auVar18,auVar18,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._6_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 7] = uVar2 + '\a';
    }
    auVar14 = auVar8 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar28._4_4_ = iVar13;
    auVar28._0_4_ = iVar13;
    auVar28._8_4_ = iVar23;
    auVar28._12_4_ = iVar23;
    auVar36._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar36._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar36._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar36._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar19._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar36;
    auVar14 = pshuflw(auVar28,auVar19,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 8] = uVar2 + '\b';
    }
    auVar14 = packssdw(auVar19,auVar19);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._8_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 9] = uVar2 + '\t';
    }
    auVar14 = auVar7 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar29._4_4_ = iVar13;
    auVar29._0_4_ = iVar13;
    auVar29._8_4_ = iVar23;
    auVar29._12_4_ = iVar23;
    auVar37._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar37._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar37._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar37._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar20._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar37;
    auVar14 = packssdw(auVar29,auVar20);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 10] = uVar2 + '\n';
    }
    auVar14 = pshufhw(auVar20,auVar20,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._10_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 0xb] = uVar2 + '\v';
    }
    auVar14 = auVar6 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar30._4_4_ = iVar13;
    auVar30._0_4_ = iVar13;
    auVar30._8_4_ = iVar23;
    auVar30._12_4_ = iVar23;
    auVar38._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar38._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar38._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar38._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar21._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar38;
    auVar14 = pshuflw(auVar30,auVar21,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 0xc] = uVar2 + '\f';
    }
    auVar14 = packssdw(auVar21,auVar21);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._12_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 0xd] = uVar2 + '\r';
    }
    auVar14 = auVar4 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar31._4_4_ = iVar13;
    auVar31._0_4_ = iVar13;
    auVar31._8_4_ = iVar23;
    auVar31._12_4_ = iVar23;
    auVar39._0_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar39._4_4_ = -(uint)(iVar13 < -0x7fffff01);
    auVar39._8_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar39._12_4_ = -(uint)(iVar23 < -0x7fffff01);
    auVar22._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar39;
    auVar14 = packssdw(auVar31,auVar22);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar3 + 0xe] = uVar2 + '\x0e';
    }
    auVar14 = pshufhw(auVar22,auVar22,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._14_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar3 + 0xf] = uVar2 + '\x0f';
    }
    lVar3 = lVar3 + 0x10;
    lVar5 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar5 + 0x10;
    lVar5 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 0x10;
    auVar11._8_8_ = lVar5 + 0x10;
    lVar5 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 0x10;
    auVar10._8_8_ = lVar5 + 0x10;
    lVar5 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 0x10;
    auVar9._8_8_ = lVar5 + 0x10;
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 0x10;
    auVar8._8_8_ = lVar5 + 0x10;
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 0x10;
    auVar7._8_8_ = lVar5 + 0x10;
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 0x10;
    auVar6._8_8_ = lVar5 + 0x10;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 0x10;
    auVar4._8_8_ = lVar5 + 0x10;
  } while (lVar3 != 0x100);
  (in_RDI->key)._M_elems[0x28] = ')';
  (in_RDI->key)._M_elems[0x29] = '(';
  (in_RDI->key)._M_elems[0x3c] = '>';
  (in_RDI->key)._M_elems[0x5b] = ']';
  (in_RDI->key)._M_elems[0x7b] = '}';
  (in_RDI->key)._M_elems[0x3e] = '<';
  (in_RDI->key)._M_elems[0x5d] = '[';
  (in_RDI->key)._M_elems[0x7d] = '{';
  (in_RDI->key)._M_elems[2] = '\x03';
  (in_RDI->key)._M_elems[3] = '\x02';
  (in_RDI->key)._M_elems[0xe] = '\x0f';
  (in_RDI->key)._M_elems[0xf] = '\x0e';
  (in_RDI->key)._M_elems[0x11] = '\x13';
  (in_RDI->key)._M_elems[0x13] = '\x11';
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> pairMapper()
{
    CharMapper<unsigned char> dMap(0);
    for (unsigned char ii = 0; ii < 255; ++ii) {
        dMap.addKey(ii, ii);
    }
    dMap.addKey('(', ')');
    dMap.addKey('<', '>');
    dMap.addKey('[', ']');
    dMap.addKey('{', '}');
    dMap.addKey(')', '(');
    dMap.addKey('>', '<');
    dMap.addKey(']', '[');
    dMap.addKey('}', '{');
    dMap.addKey(0x02, 0x03);  // start of text, end of text
    dMap.addKey(0x03, 0x02);
    dMap.addKey(0x0E, 0x0F);  // XON, XOFF
    dMap.addKey(0x0F, 0x0E);
    dMap.addKey(0x11, 0x13);  // XON, XOFF
    dMap.addKey(0x13, 0x11);
    return dMap;
}